

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O3

bool __thiscall libcellml::Model::hasImports(Model *this)

{
  EntityImpl *pEVar1;
  __weak_count<(__gnu_cxx::_Lock_policy)2> this_00;
  bool bVar2;
  ulong uVar3;
  bool bVar4;
  UnitsPtr units;
  undefined1 local_48 [16];
  element_type *local_38;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  pEVar1 = (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
  if (pEVar1[4].mId.field_2._M_allocated_capacity != pEVar1[4].mId._M_string_length) {
    uVar3 = 1;
    do {
      Model::units((Model *)local_48,(size_t)this);
      bVar2 = hasUnitsImports((UnitsPtr *)local_48);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
      }
      pEVar1 = (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
               mPimpl;
      bVar4 = uVar3 < (ulong)((long)(pEVar1[4].mId.field_2._M_allocated_capacity -
                                    pEVar1[4].mId._M_string_length) >> 4);
      uVar3 = uVar3 + 1;
    } while (bVar4 && !bVar2);
    if (bVar2) {
      return true;
    }
  }
  std::__shared_ptr<libcellml::Model_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Model,void>
            ((__shared_ptr<libcellml::Model_const,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (__weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<libcellml::Model>);
  this_00._M_pi = _Stack_30._M_pi;
  local_48._0_8_ = local_38;
  local_48._8_8_ = _Stack_30._M_pi;
  local_38 = (element_type *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar2 = hasComponentImports((ComponentEntityConstPtr *)local_48);
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
  }
  return bVar2;
}

Assistant:

bool Model::hasImports() const
{
    bool importsPresent = false;
    for (size_t index = 0; (index < unitsCount()) && !importsPresent; ++index) {
        libcellml::UnitsPtr units = Model::units(index);
        importsPresent = hasUnitsImports(units);
    }

    if (!importsPresent) {
        importsPresent = hasComponentImports(shared_from_this());
    }

    return importsPresent;
}